

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusNonStationary.cpp
# Opt level: O2

void __thiscall
PerseusNonStationary::InitializeBeliefs(PerseusNonStationary *this,int nrB,bool uniquify)

{
  undefined7 in_register_00000011;
  Arguments args;
  BeliefSetNonStationary local_270;
  undefined1 local_258 [568];
  
  ArgumentHandlers::Arguments::Arguments((Arguments *)local_258);
  local_258._252_4_ = (undefined4)CONCAT71(in_register_00000011,uniquify);
  local_258._256_4_ = nrB;
  AlphaVectorPlanning::SampleBeliefsNonStationary
            (&local_270,
             (AlphaVectorPlanning *)
             ((long)&(this->super_Perseus)._vptr_Perseus +
             (long)(this->super_Perseus)._vptr_Perseus[-3]),(Arguments *)local_258);
  SetBeliefSet(this,&local_270);
  BeliefSetNonStationary::~BeliefSetNonStationary(&local_270);
  std::__cxx11::string::~string((string *)(local_258 + 0x1e8));
  return;
}

Assistant:

void PerseusNonStationary::InitializeBeliefs(int nrB, bool uniquify)
{
    ArgumentHandlers::Arguments args;
    args.nrBeliefs=nrB;
    args.uniqueBeliefs=uniquify;
    SetBeliefSet(SampleBeliefsNonStationary(args));
}